

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::emitResultType(BinaryInstWriter *this,Type type)

{
  BufferWithRandomAccess *pBVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  undefined8 in_RAX;
  undefined1 uVar4;
  undefined7 in_register_00000009;
  void *__buf;
  bool bVar5;
  bool bVar6;
  undefined8 uStack_18;
  
  if (type.id == 1) {
    WasmBinaryWriter::writeType(this->parent,(Type)0x0);
    return;
  }
  bVar5 = type.id < 7;
  uStack_18 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar5);
  bVar6 = (type.id & 1) == 0;
  uVar4 = bVar6 || bVar5;
  if (!bVar6 && !bVar5) {
    pBVar1 = this->o;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = type.id;
    uVar3 = WasmBinaryWriter::getSignatureIndex(this->parent,(Signature)(auVar2 << 0x40));
    uStack_18 = CONCAT44(uVar3,(undefined4)uStack_18);
    LEB<int,_signed_char>::write
              ((LEB<int,_signed_char> *)((long)&uStack_18 + 4),(int)pBVar1,__buf,
               CONCAT71(in_register_00000009,uVar4));
    return;
  }
  WasmBinaryWriter::writeType(this->parent,type);
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }